

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_CR_OR_LF(FlowBuffer *this)

{
  const_byteptr puVar1;
  const_byteptr puVar2;
  long lVar3;
  long lVar4;
  
  puVar1 = this->orig_data_begin_;
  if ((puVar1 == (const_byteptr)0x0) ||
     (puVar2 = this->orig_data_end_, puVar2 == (const_byteptr)0x0)) {
    return;
  }
  if ((puVar1 < puVar2) && ((this->state_ == CR_OR_LF_1 && (*puVar1 == '\n')))) {
    this->state_ = CR_OR_LF_0;
    this->orig_data_begin_ = puVar1 + 1;
  }
  puVar1 = this->orig_data_begin_;
  if (puVar1 < puVar2) {
    lVar4 = 0;
    do {
      if (puVar1[lVar4] == '\n') {
LAB_00102920:
        if (this->buffer_n_ == 0) {
          this->frame_length_ = (int)lVar4;
        }
        else {
          AppendToBuffer(this,puVar1,(int)lVar4 + 1);
          this->buffer_n_ = this->buffer_n_ + -1;
        }
        this->message_complete_ = true;
        return;
      }
      if (puVar1[lVar4] == '\r') {
        this->state_ = CR_OR_LF_1;
        goto LAB_00102920;
      }
      lVar3 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (puVar1 + lVar3 != puVar2);
  }
  AppendToBuffer(this,puVar1,(int)puVar2 - (int)puVar1);
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_CR_OR_LF()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	if ( state_ == CR_OR_LF_1 && orig_data_begin_ < orig_data_end_ && *orig_data_begin_ == LF )
		{
		state_ = CR_OR_LF_0;
		++orig_data_begin_;
		}

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		switch ( *data )
			{
			case CR:
				state_ = CR_OR_LF_1;
				goto found_end_of_line;

			case LF:
				// state_ = CR_OR_LF_0;
				goto found_end_of_line;

			default:
				// state_ = CR_OR_LF_0;
				break;
			}
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last CR or LF
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}